

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

void cmSystemTools::GlobDirs
               (string *path,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  int iVar3;
  long lVar4;
  Status SVar5;
  unsigned_long uVar6;
  char *pcVar7;
  uint uVar8;
  ulong dindex;
  bool bVar9;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  Directory d;
  string startPath;
  string fname;
  string finishPath;
  allocator<char> local_f9;
  Directory local_f8;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  undefined1 *local_e0;
  undefined1 *puStack_d8;
  size_t local_d0;
  char *local_c8;
  string local_c0;
  string local_a0;
  long *local_80 [2];
  long local_70 [2];
  undefined1 *local_60;
  undefined1 *puStack_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  
  lVar4 = std::__cxx11::string::find((char *)path,0x753bec,0);
  if (lVar4 == -1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(files,path);
    return;
  }
  std::__cxx11::string::substr((ulong)&local_c0,(ulong)path);
  std::__cxx11::string::substr((ulong)local_80,(ulong)path);
  cmsys::Directory::Directory(&local_f8);
  SVar5 = cmsys::Directory::Load(&local_f8,&local_c0,(string *)0x0);
  if (SVar5.Kind_ == Success) {
    uVar8 = 0;
    while( true ) {
      uVar6 = cmsys::Directory::GetNumberOfFiles(&local_f8);
      dindex = (ulong)uVar8;
      if (uVar6 <= dindex) break;
      pcVar7 = cmsys::Directory::GetFile(&local_f8,dindex);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,pcVar7,(allocator<char> *)&local_a0);
      iVar3 = std::__cxx11::string::compare((char *)&local_f0);
      if (iVar3 == 0) {
        bVar9 = false;
      }
      else {
        pcVar7 = cmsys::Directory::GetFile(&local_f8,dindex);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,pcVar7,&local_f9);
        iVar3 = std::__cxx11::string::compare((char *)&local_60);
        bVar9 = iVar3 != 0;
        if (local_60 != &local_50) {
          operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
        }
      }
      if ((undefined1 **)local_f0._M_len != &local_e0) {
        operator_delete((void *)local_f0._M_len,(ulong)(local_e0 + 1));
      }
      sVar2 = local_c0._M_string_length;
      _Var1._M_p = local_c0._M_dataplus._M_p;
      if (bVar9) {
        local_60 = (undefined1 *)0x1;
        puStack_58 = &local_50;
        local_50 = 0x2f;
        pcVar7 = cmsys::Directory::GetFile(&local_f8,dindex);
        local_f0._M_len = sVar2;
        local_f0._M_str = _Var1._M_p;
        local_e0 = local_60;
        puStack_d8 = puStack_58;
        local_d0 = strlen(pcVar7);
        views._M_len = 3;
        views._M_array = &local_f0;
        local_c8 = pcVar7;
        cmCatViews_abi_cxx11_(&local_a0,views);
        bVar9 = cmsys::SystemTools::FileIsDirectory(&local_a0);
        if (bVar9) {
          std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80[0]);
          GlobDirs(&local_a0,files);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
      }
      uVar8 = uVar8 + 1;
    }
  }
  cmsys::Directory::~Directory(&local_f8);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmSystemTools::GlobDirs(const std::string& path,
                             std::vector<std::string>& files)
{
  std::string::size_type pos = path.find("/*");
  if (pos == std::string::npos) {
    files.push_back(path);
    return;
  }
  std::string startPath = path.substr(0, pos);
  std::string finishPath = path.substr(pos + 2);

  cmsys::Directory d;
  if (d.Load(startPath)) {
    for (unsigned int i = 0; i < d.GetNumberOfFiles(); ++i) {
      if ((std::string(d.GetFile(i)) != ".") &&
          (std::string(d.GetFile(i)) != "..")) {
        std::string fname = cmStrCat(startPath, '/', d.GetFile(i));
        if (cmSystemTools::FileIsDirectory(fname)) {
          fname += finishPath;
          cmSystemTools::GlobDirs(fname, files);
        }
      }
    }
  }
}